

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_specialization_info
          (Impl *this,Value *spec_info,VkSpecializationInfo **out_info)

{
  bool bVar1;
  uint uVar2;
  SizeType SVar3;
  VkSpecializationInfo *pVVar4;
  Type pGVar5;
  Ch *data;
  uint8_t *puVar6;
  
  pVVar4 = ScratchAllocator::allocate_cleared<VkSpecializationInfo>(&this->allocator);
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)spec_info,"dataSize");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar5);
  pVVar4->dataSize = (ulong)uVar2;
  pGVar5 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)spec_info,"data");
  data = rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetString(pGVar5);
  puVar6 = decode_base64(&this->allocator,data,pVVar4->dataSize);
  pVVar4->pData = puVar6;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(spec_info,"mapEntries");
  if (bVar1) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)spec_info,"mapEntries");
    SVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar5);
    pVVar4->mapEntryCount = SVar3;
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)spec_info,"mapEntries");
    parse_map_entries(this,pGVar5,&pVVar4->pMapEntries);
  }
  *out_info = pVVar4;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_specialization_info(const Value &spec_info, const VkSpecializationInfo **out_info)
{
	auto *spec = allocator.allocate_cleared<VkSpecializationInfo>();
	spec->dataSize = spec_info["dataSize"].GetUint();
	spec->pData = decode_base64(allocator, spec_info["data"].GetString(), spec->dataSize);
	if (spec_info.HasMember("mapEntries"))
	{
		spec->mapEntryCount = spec_info["mapEntries"].Size();
		if (!parse_map_entries(spec_info["mapEntries"], &spec->pMapEntries))
			return false;
	}

	*out_info = spec;
	return true;
}